

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Satoko(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint fSplit;
  int iVar3;
  char *pcVar4;
  satoko_opts_t opts;
  uint local_a4;
  satoko_opts_t local_98;
  
  satoko_default_opts(&local_98);
  fSplit = 0;
  Extra_UtilGetoptReset();
  local_a4 = 0;
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"Csivh"), iVar3 = globalUtilOptind, 0x68 < iVar1) {
      if (iVar1 == 0x76) {
        local_98.verbose = local_98.verbose ^ 1;
      }
      else if (iVar1 == 0x69) {
        local_a4 = local_a4 ^ 1;
      }
      else {
        if (iVar1 != 0x73) goto LAB_0026f9b3;
        fSplit = fSplit ^ 1;
      }
    }
    if (iVar1 != 0x43) {
      if (iVar1 == -1) {
        if (globalUtilOptind + 1 == argc) {
          Gia_ManSatokoDimacs(argv[globalUtilOptind],&local_98);
        }
        else {
          if (pAbc->pGia == (Gia_Man_t *)0x0) {
            pcVar2 = "Abc_CommandAbc9Satoko(): There is no AIG.\n";
            iVar3 = -1;
            goto LAB_0026fa78;
          }
          Gia_ManSatokoCall(pAbc->pGia,&local_98,fSplit,local_a4);
        }
        return 0;
      }
      break;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-C\" should be followed by an integer.\n");
      break;
    }
    iVar1 = atoi(argv[globalUtilOptind]);
    local_98.conf_limit = (long)iVar1;
    globalUtilOptind = iVar3 + 1;
  } while (-1 < iVar1);
LAB_0026f9b3:
  Abc_Print(-2,"usage: &satoko [-C num] [-sivh] <file.cnf>\n");
  Abc_Print(-2,"\t             run Satoko by Bruno Schmitt\n");
  Abc_Print(-2,"\t-C num     : limit on the number of conflicts [default = %d]\n",
            local_98.conf_limit);
  pcVar4 = "yes";
  pcVar2 = "yes";
  if (fSplit == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-s         : split multi-output miter into individual outputs [default = %s]\n",
            pcVar2);
  pcVar2 = "yes";
  if (local_a4 == 0) {
    pcVar2 = "no";
  }
  Abc_Print(-2,"\t-i         : split multi-output miter and solve incrementally [default = %s]\n",
            pcVar2);
  if (local_98.verbose == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-v         : prints verbose information [default = %s]\n",pcVar4);
  Abc_Print(-2,"\t<file.cnf> : (optional) CNF file to solve\n");
  pcVar2 = "\t-h         : print the command usage\n";
  iVar3 = -2;
LAB_0026fa78:
  Abc_Print(iVar3,pcVar2);
  return 1;
}

Assistant:

int Abc_CommandAbc9Satoko( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManSatokoDimacs( char * pFileName, satoko_opts_t * opts );
    extern void Gia_ManSatokoCall( Gia_Man_t * p, satoko_opts_t * opts, int fSplit, int fIncrem );
    int c, fSplit = 0, fIncrem = 0;

    satoko_opts_t opts;
    satoko_default_opts(&opts);
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Csivh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            opts.conf_limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( opts.conf_limit < 0 )
                goto usage;
            break;
        case 's':
            fSplit ^= 1;
            break;
        case 'i':
            fIncrem ^= 1;
            break;
        case 'v':
            opts.verbose ^= 1;
            break;
        case 'h':
            goto usage;

        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
    {
        Gia_ManSatokoDimacs( argv[globalUtilOptind], &opts );
        return 0;
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Satoko(): There is no AIG.\n" );
        return 1;
    }
    Gia_ManSatokoCall( pAbc->pGia, &opts, fSplit, fIncrem );
    return 0;

usage:
    Abc_Print( -2, "usage: &satoko [-C num] [-sivh] <file.cnf>\n" );
    Abc_Print( -2, "\t             run Satoko by Bruno Schmitt\n" );
    Abc_Print( -2, "\t-C num     : limit on the number of conflicts [default = %d]\n", opts.conf_limit );
    Abc_Print( -2, "\t-s         : split multi-output miter into individual outputs [default = %s]\n", fSplit? "yes": "no" );
    Abc_Print( -2, "\t-i         : split multi-output miter and solve incrementally [default = %s]\n", fIncrem? "yes": "no" );
    Abc_Print( -2, "\t-v         : prints verbose information [default = %s]\n", opts.verbose? "yes": "no" );
    Abc_Print( -2, "\t<file.cnf> : (optional) CNF file to solve\n");
    Abc_Print( -2, "\t-h         : print the command usage\n");
    return 1;
}